

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Yolov3DetectionOutput_x86::forward
          (Yolov3DetectionOutput_x86 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
  *this_00;
  undefined4 uVar2;
  ulong uVar3;
  pointer pMVar4;
  _func_int *p_Var5;
  size_t sVar6;
  void *pvVar7;
  size_t sVar8;
  iterator __position;
  Mat *this_01;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar14;
  int iVar15;
  float *pfVar16;
  undefined4 *puVar17;
  _func_int *p_Var18;
  byte bVar19;
  int iVar20;
  BBoxRect *__args;
  long lVar21;
  float *pfVar22;
  int iVar23;
  ulong uVar24;
  Yolov3DetectionOutput_x86 *pYVar25;
  float *pfVar26;
  long lVar27;
  uint _h;
  float fVar28;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar34;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  local_1a8;
  long local_190;
  BBoxRect local_188;
  Yolov3DetectionOutput_x86 *local_168;
  uint local_15c;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_158;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  ulong local_128;
  pointer local_120;
  ulong local_118;
  float *local_110;
  float *local_108;
  float *local_100;
  float local_f8;
  float fStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  float local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_d8;
  Option *local_d0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_c8;
  long local_c0;
  long local_b8;
  void *local_b0;
  ulong local_a8;
  ulong local_a0;
  void *local_98;
  long local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_158.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8 = top_blobs;
  local_d0 = opt;
  if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar24 = 0;
    local_168 = this;
    local_c8 = bottom_blobs;
    do {
      pvVar14 = local_c8;
      pYVar25 = local_168;
      local_1a8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::resize(&local_1a8,
               (long)*(int *)(&local_168->field_0xd4 +
                             (long)local_168->_vptr_Yolov3DetectionOutput_x86[-3]));
      pMVar4 = (pvVar14->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      p_Var5 = pYVar25->_vptr_Yolov3DetectionOutput_x86[-3];
      iVar15 = pMVar4[uVar24].c / *(int *)(&pYVar25->field_0xd4 + (long)p_Var5);
      if (iVar15 != *(int *)(&pYVar25->field_0xd0 + (long)p_Var5) + 5) {
        std::
        vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ::~vector(&local_1a8);
        iVar15 = -1;
        goto LAB_0048358a;
      }
      local_128 = uVar24;
      if (0 < *(int *)(&pYVar25->field_0xd4 + (long)pYVar25->_vptr_Yolov3DetectionOutput_x86[-3])) {
        local_120 = pMVar4 + uVar24;
        uVar3._0_4_ = local_120->w;
        uVar3._4_4_ = local_120->h;
        local_68._0_4_ = (float)(int)(undefined4)uVar3;
        local_68._4_4_ = (undefined4)(int)uVar3._4_4_;
        p_Var18 = (_func_int *)
                  ((long)&pYVar25->_vptr_Yolov3DetectionOutput_x86 +
                  (long)pYVar25->_vptr_Yolov3DetectionOutput_x86[-3]);
        fVar28 = *(float *)(*(long *)(&pYVar25->field_0x170 + (long)p_Var5) + uVar24 * 4);
        auVar37._0_4_ = -(uint)(0 < (int)(undefined4)uVar3);
        auVar37._4_4_ = -(uint)(0 < (int)(undefined4)uVar3);
        auVar37._8_4_ = -(uint)(0 < (int)uVar3._4_4_);
        auVar37._12_4_ = -(uint)(0 < (int)uVar3._4_4_);
        local_15c = movmskpd((int)*(long *)(&pYVar25->field_0x170 + (long)p_Var5),auVar37);
        bVar19 = (byte)local_15c;
        local_88 = (float)(int)(fVar28 * local_68._0_4_);
        fStack_84 = (float)(int)(fVar28 * (float)local_68._4_4_);
        fStack_80 = (float)(int)(fVar28 * 0.0);
        fStack_7c = (float)(int)(fVar28 * 0.0);
        local_118 = uVar3 & 0xffffffff;
        local_c0 = (long)iVar15;
        auVar29._4_4_ = uVar3._4_4_;
        auVar29._0_4_ = uVar3._4_4_;
        auVar29._8_4_ = uVar3._4_4_;
        auVar29._12_4_ = uVar3._4_4_;
        local_a8 = (ulong)(uint)uVar3._4_4_;
        register0x000012c8 = 0x3f0000003f000000;
        auVar29 = rcpps(auVar29,_local_68);
        local_78 = auVar29._0_4_;
        fStack_74 = auVar29._4_4_;
        fStack_70 = auVar29._8_4_;
        fStack_6c = auVar29._12_4_;
        local_78 = (1.0 - local_68._0_4_ * local_78) * local_78 + local_78;
        fStack_74 = (1.0 - (float)local_68._4_4_ * fStack_74) * fStack_74 + fStack_74;
        fStack_70 = (1.0 - fStack_70 * 0.5) * fStack_70 + fStack_70;
        fStack_6c = (1.0 - fStack_6c * 0.5) * fStack_6c + fStack_6c;
        local_b8 = (long)*(int *)(&pYVar25->field_0xd4 + (long)p_Var5) * uVar24 * 4;
        local_190 = 0;
        do {
          uVar24 = local_120->elemsize;
          if (bVar19 >> 1 != 0) {
            lVar21 = local_190 * local_c0;
            register0x00001248 =
                 *(undefined8 *)
                  (*(long *)(p_Var18 + 0xe0) +
                  (long)((int)*(float *)(*(long *)(p_Var18 + 0x128) + local_b8 + local_190 * 4) * 2)
                  * 4);
            local_58 = 0x3f8000003f800000;
            local_b0 = (void *)((lVar21 + 5) * local_120->cstep * uVar24 + (long)local_120->data);
            sVar6 = local_120->cstep;
            pvVar7 = local_120->data;
            sVar8 = local_120->elemsize;
            pfVar26 = (float *)((lVar21 + 4) * sVar6 * sVar8 + (long)pvVar7);
            local_100 = (float *)((lVar21 + 3) * sVar6 * sVar8 + (long)pvVar7);
            local_108 = (float *)((lVar21 + 2) * sVar6 * sVar8 + (long)pvVar7);
            local_110 = (float *)((lVar21 + 1) * sVar6 * sVar8 + (long)pvVar7);
            pfVar22 = (float *)(lVar21 * sVar6 * sVar8 + (long)pvVar7);
            iVar15 = (int)(((long)local_120->d * uVar24 * (long)local_120->h * (long)local_120->w +
                            0xf & 0xfffffffffffffff0) / uVar24);
            local_90 = (long)iVar15;
            uVar24 = 0;
            do {
              local_a0 = uVar24;
              if ((local_15c & 1) != 0) {
                local_48 = (float)(int)uVar24;
                local_98 = (void *)((long)local_b0 + uVar24 * local_118 * 4);
                fStack_40 = local_88;
                fStack_3c = fStack_84;
                uVar24 = 0;
                fStack_44 = local_48;
                do {
                  p_Var5 = pYVar25->_vptr_Yolov3DetectionOutput_x86[-3];
                  lVar21 = *(int *)(&pYVar25->field_0xd0 + (long)p_Var5) * local_90;
                  if ((int)lVar21 < 1) {
                    iVar23 = 0;
                    local_e8 = -3.4028235e+38;
                  }
                  else {
                    pfVar16 = (float *)((long)local_98 + uVar24 * 4);
                    pfVar1 = pfVar16 + lVar21;
                    iVar23 = 0;
                    local_e8 = -3.4028235e+38;
                    iVar20 = 0;
                    do {
                      fVar28 = *pfVar16;
                      if (local_e8 < fVar28) {
                        iVar23 = iVar20;
                      }
                      if (local_e8 <= fVar28) {
                        local_e8 = fVar28;
                      }
                      pfVar16 = pfVar16 + iVar15;
                      iVar20 = iVar20 + 1;
                    } while (pfVar16 < pfVar1);
                  }
                  uStack_e4 = 0;
                  uStack_e0 = 0;
                  uStack_dc = 0;
                  local_138 = expf(-*pfVar26);
                  fVar28 = expf(-local_e8);
                  pYVar25 = local_168;
                  fVar28 = 1.0 / ((fVar28 + 1.0) * local_138 + 1.0);
                  if (*(float *)(&local_168->field_0xd8 + (long)p_Var5) <= fVar28) {
                    auVar29 = ZEXT416((uint)*local_110);
                    local_f8 = -*pfVar22;
                    fStack_f4 = -*local_110;
                    uStack_f0 = 0x80000000;
                    uStack_ec = 0x80000000;
                    local_e8 = fVar28;
                    local_138 = expf(local_f8);
                    fStack_134 = extraout_XMM0_Db;
                    fVar28 = expf(fStack_f4);
                    local_138 = local_138 + 1.0;
                    fStack_130 = fStack_134 + 0.0;
                    fStack_12c = extraout_XMM0_Db_00 + 0.0;
                    fStack_134 = fVar28 + 1.0;
                    local_f8 = expf(*local_108);
                    fVar28 = expf(*local_100);
                    local_188.score = local_e8;
                    auVar13._4_4_ = fStack_134;
                    auVar13._0_4_ = local_138;
                    auVar13._8_4_ = fStack_130;
                    auVar13._12_4_ = fStack_12c;
                    auVar29 = rcpps(auVar29,auVar13);
                    auVar36._0_4_ = (float)local_58._0_4_ * auVar29._0_4_;
                    auVar36._4_4_ = (float)local_58._4_4_ * auVar29._4_4_;
                    auVar36._8_4_ = fStack_50 * auVar29._8_4_;
                    auVar36._12_4_ = fStack_4c * auVar29._12_4_;
                    fVar30 = ((float)local_58._4_4_ - fStack_134 * auVar36._4_4_) * auVar29._4_4_ +
                             auVar36._4_4_;
                    auVar9._4_8_ = auVar29._8_8_;
                    auVar9._0_4_ = fStack_44;
                    auVar32._0_8_ = auVar9._0_8_ << 0x20;
                    auVar32._8_4_ = fStack_40;
                    auVar32._12_4_ = fStack_3c;
                    auVar33._4_12_ = auVar32._4_12_;
                    auVar33._0_4_ = (float)(int)uVar24;
                    auVar37 = rcpps(auVar36,auVar33);
                    fVar40 = fVar30 * auVar37._4_4_;
                    local_188.area = local_f8 * fStack_50 * auVar37._8_4_;
                    fVar41 = fVar28 * fStack_4c * auVar37._12_4_;
                    local_188.area =
                         (local_f8 * fStack_50 - fStack_40 * local_188.area) * auVar37._8_4_ +
                         local_188.area;
                    fVar41 = (fVar28 * fStack_4c - fStack_3c * fVar41) * auVar37._12_4_ + fVar41;
                    fVar28 = (((float)local_58._0_4_ - local_138 * auVar36._0_4_) * auVar29._0_4_ +
                              auVar36._0_4_ + auVar33._0_4_) * local_78;
                    fVar31 = (fVar30 + fStack_44) * fStack_74;
                    fVar34 = local_188.area * fStack_60;
                    fVar35 = fVar41 * fStack_5c;
                    auVar38._4_4_ = fVar35;
                    auVar38._0_4_ = fVar34;
                    auVar38._8_4_ = fVar28;
                    auVar38._12_4_ = fVar31;
                    local_188.xmin = fVar28 - fVar34;
                    local_188.ymin = fVar31 - fVar35;
                    auVar10._4_8_ = auVar38._8_8_;
                    auVar10._0_4_ =
                         fVar35 + ((fVar30 - fStack_44 * fVar40) * auVar37._4_4_ + fVar40) *
                                  (float)local_68._4_4_;
                    auVar39._0_8_ = auVar10._0_8_ << 0x20;
                    auVar39._8_4_ = fVar28 + fVar34;
                    auVar39._12_4_ = fVar31 + fVar35;
                    local_188.area = local_188.area * fVar41;
                    this_00 = (vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                               *)(local_1a8.
                                  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_190);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_188.xmax = auVar39._8_4_;
                    local_188.ymax = auVar39._12_4_;
                    local_188.label = iVar23;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::
                      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                                (this_00,__position,&local_188);
                    }
                    else {
                      (__position._M_current)->xmax = (float)(int)auVar39._8_8_;
                      (__position._M_current)->ymax = (float)(int)((ulong)auVar39._8_8_ >> 0x20);
                      (__position._M_current)->area = local_188.area;
                      (__position._M_current)->label = iVar23;
                      (__position._M_current)->score = local_e8;
                      (__position._M_current)->xmin = local_188.xmin;
                      (__position._M_current)->ymin = local_188.ymin;
                      (__position._M_current)->xmax = auVar39._8_4_;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x1c;
                    }
                  }
                  pfVar22 = pfVar22 + 1;
                  local_110 = local_110 + 1;
                  local_108 = local_108 + 1;
                  local_100 = local_100 + 1;
                  pfVar26 = pfVar26 + 1;
                  uVar24 = uVar24 + 1;
                } while (uVar24 != local_118);
              }
              uVar24 = local_a0 + 1;
            } while (uVar24 != local_a8);
          }
          local_190 = local_190 + 1;
          p_Var18 = (_func_int *)
                    ((long)&pYVar25->_vptr_Yolov3DetectionOutput_x86 +
                    (long)pYVar25->_vptr_Yolov3DetectionOutput_x86[-3]);
        } while (local_190 <
                 *(int *)(&pYVar25->field_0xd4 + (long)pYVar25->_vptr_Yolov3DetectionOutput_x86[-3])
                );
      }
      uVar24 = local_128;
      if (0 < *(int *)(&pYVar25->field_0xd4 + (long)pYVar25->_vptr_Yolov3DetectionOutput_x86[-3])) {
        lVar21 = 8;
        lVar27 = 0;
        do {
          std::
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
          ::
          _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>>
                    ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      *)&local_158,
                     local_158.
                     super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     *(undefined8 *)
                      ((long)local_1a8.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar21 + -8),
                     *(undefined8 *)
                      ((long)&((local_1a8.
                                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar21));
          lVar27 = lVar27 + 1;
          lVar21 = lVar21 + 0x18;
        } while (lVar27 < *(int *)(&local_168->field_0xd4 +
                                  (long)local_168->_vptr_Yolov3DetectionOutput_x86[-3]));
      }
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector(&local_1a8);
      uVar24 = uVar24 + 1;
      this = local_168;
    } while (uVar24 < (ulong)(((long)(local_c8->
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_c8->
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x71c71c71c71c71c7));
  }
  Yolov3DetectionOutput::qsort_descent_inplace
            ((Yolov3DetectionOutput *)
             ((long)&this->_vptr_Yolov3DetectionOutput_x86 +
             (long)this->_vptr_Yolov3DetectionOutput_x86[-3]),&local_158);
  local_188.score = 0.0;
  local_188.xmin = 0.0;
  local_188.ymin = 0.0;
  local_188.xmax = 0.0;
  local_188.ymax = 0.0;
  local_188.area = 0.0;
  Yolov3DetectionOutput::nms_sorted_bboxes
            ((Yolov3DetectionOutput *)
             ((long)&this->_vptr_Yolov3DetectionOutput_x86 +
             (long)this->_vptr_Yolov3DetectionOutput_x86[-3]),&local_158,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188,
             *(float *)(&this->field_0xdc + (long)this->_vptr_Yolov3DetectionOutput_x86[-3]));
  local_1a8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar21 = CONCAT44(local_188.xmin,local_188.score);
  if (CONCAT44(local_188.xmax,local_188.ymin) != lVar21) {
    uVar24 = 0;
    do {
      __args = local_158.
               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
               ._M_impl.super__Vector_impl_data._M_start + *(long *)(lVar21 + uVar24 * 8);
      if (local_1a8.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_1a8.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
        ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                  ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                    *)&local_1a8,
                   (iterator)
                   local_1a8.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__args);
      }
      else {
        uVar11 = *(undefined8 *)__args;
        uVar12 = *(undefined8 *)&__args->ymin;
        *(undefined1 (*) [16])
         ((long)local_1a8.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 0xc) =
             *(undefined1 (*) [16])&__args->xmax;
        *(undefined8 *)
         local_1a8.
         super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish = uVar11;
        *(undefined8 *)
         ((long)local_1a8.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) = uVar12;
        local_1a8.
        super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_1a8.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 0x1c);
      }
      uVar24 = uVar24 + 1;
      lVar21 = CONCAT44(local_188.xmin,local_188.score);
    } while (uVar24 < (ulong)(CONCAT44(local_188.xmax,local_188.ymin) - lVar21 >> 3));
  }
  _h = (int)((long)local_1a8.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_1a8.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x49249249;
  iVar15 = 0;
  if (_h != 0) {
    this_01 = (local_d8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_01,6,_h,4,local_d0->blob_allocator);
    iVar15 = -100;
    if (((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) &&
       (iVar15 = 0, 0 < (int)_h)) {
      iVar23 = this_01->w;
      sVar6 = this_01->elemsize;
      puVar17 = (undefined4 *)((long)this_01->data + 0x14);
      iVar15 = 0;
      lVar21 = 0;
      do {
        uVar2 = *(undefined4 *)
                 ((long)&((local_1a8.
                           super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar21);
        puVar17[-5] = (float)*(int *)((long)&local_1a8.
                                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].
                                             super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar21) +
                      1.0;
        puVar17[-4] = uVar2;
        puVar17[-3] = *(undefined4 *)
                       ((long)&((local_1a8.
                                 super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar21 + 4);
        puVar17[-2] = *(undefined4 *)
                       ((long)&((local_1a8.
                                 super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               )._M_impl.super__Vector_impl_data._M_finish + lVar21);
        puVar17[-1] = *(undefined4 *)
                       ((long)&((local_1a8.
                                 super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               )._M_impl.super__Vector_impl_data._M_finish + lVar21 + 4);
        *puVar17 = *(undefined4 *)
                    ((long)&((local_1a8.
                              super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                            )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar21);
        lVar21 = lVar21 + 0x1c;
        puVar17 = (undefined4 *)((long)puVar17 + (long)iVar23 * sVar6);
      } while ((ulong)(_h & 0x7fffffff) * 0x1c != lVar21);
    }
  }
  if (local_1a8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.
                    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a8.
                          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.
                          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar7 = (void *)CONCAT44(local_188.xmin,local_188.score);
  if (pvVar7 != (void *)0x0) {
    operator_delete(pvVar7,CONCAT44(local_188.area,local_188.ymax) - (long)pvVar7);
  }
LAB_0048358a:
  if (local_158.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar15;
}

Assistant:

int Yolov3DetectionOutput_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = (int)scores.cstep;

#if __AVX2__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + expf(-box_score_ptr[0]) * (1.f + expf(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = expf(wptr[0]) * bias_w / net_w;
                        float bbox_h = expf(hptr[0]) * bias_h / net_h;

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1.0f; // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}